

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

bool __thiscall
kratos::InsertClockIRVisitor::has_clk_en_stmt(InsertClockIRVisitor *this,StmtBlock *block)

{
  bool bVar1;
  __type_conflict2 _Var2;
  StatementType SVar3;
  VarType VVar4;
  PortType PVar5;
  VarCastType VVar6;
  element_type *this_00;
  element_type *peVar7;
  element_type *this_01;
  element_type *this_02;
  undefined1 local_88 [8];
  shared_ptr<kratos::VarCasted> casted;
  undefined1 local_70 [8];
  shared_ptr<kratos::Port> p;
  shared_ptr<kratos::Var> cond;
  undefined1 local_40 [8];
  shared_ptr<kratos::IfStmt> if_;
  shared_ptr<kratos::Stmt> stmt;
  StmtBlock *block_local;
  InsertClockIRVisitor *this_local;
  
  bVar1 = StmtBlock::empty(block);
  if (!bVar1) {
    StmtBlock::get_stmt((StmtBlock *)
                        &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,(uint64_t)block);
    this_00 = std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount);
    SVar3 = Stmt::type(this_00);
    if (SVar3 == If) {
      std::__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      Stmt::as<kratos::IfStmt>((Stmt *)local_40);
      std::__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 local_40);
      IfStmt::predicate((IfStmt *)
                        &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount);
      VVar4 = Var::type(peVar7);
      if (VVar4 == PortIO) {
        std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        Var::as<kratos::Port>((Var *)local_70);
        this_01 = std::__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<kratos::Port,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_70);
        PVar5 = Port::port_type(this_01);
        if (PVar5 == ClockEnable) {
          this_local._7_1_ = 1;
        }
        casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _5_3_ = 0;
        casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_1_ = PVar5 == ClockEnable;
        std::shared_ptr<kratos::Port>::~shared_ptr((shared_ptr<kratos::Port> *)local_70);
        if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi._4_4_ == 0) {
LAB_003c5512:
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ = 0;
        }
      }
      else {
        peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        VVar4 = Var::type(peVar7);
        if (VVar4 == BaseCasted) {
          std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          Var::as<kratos::VarCasted>((Var *)local_88);
          this_02 = std::
                    __shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)local_88);
          VVar6 = VarCasted::cast_type(this_02);
          this_local._7_1_ = VVar6 == ClockEnable;
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ = 1;
          std::shared_ptr<kratos::VarCasted>::~shared_ptr((shared_ptr<kratos::VarCasted> *)local_88)
          ;
        }
        else {
          peVar7 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          _Var2 = std::operator==(&peVar7->name,&this->clk_en_name_);
          if (!_Var2) goto LAB_003c5512;
          this_local._7_1_ = 1;
          casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ = 1;
        }
      }
      std::shared_ptr<kratos::Var>::~shared_ptr
                ((shared_ptr<kratos::Var> *)
                 &p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<kratos::IfStmt>::~shared_ptr((shared_ptr<kratos::IfStmt> *)local_40);
      if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          ._4_4_ == 0) goto LAB_003c5536;
    }
    else {
LAB_003c5536:
      casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _4_4_ = 0;
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &if_.super___shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (casted.super___shared_ptr<kratos::VarCasted,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
        _4_4_ != 0) goto LAB_003c5562;
  }
  this_local._7_1_ = 0;
LAB_003c5562:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool has_clk_en_stmt(StmtBlock* block) const {
        if (!block->empty()) {
            auto stmt = block->get_stmt(0);
            if (stmt->type() == StatementType::If) {
                auto if_ = stmt->as<IfStmt>();
                auto cond = if_->predicate();
                if (cond->type() == VarType::PortIO) {
                    auto p = cond->as<Port>();
                    if (p->port_type() == PortType::ClockEnable) {
                        return true;
                    }
                } else if (cond->type() == VarType::BaseCasted) {
                    auto casted = cond->as<VarCasted>();
                    return casted->cast_type() == VarCastType::ClockEnable;
                } else if (cond->name == clk_en_name_) {
                    return true;
                }
            }
        }
        return false;
    }